

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileReader.cxx
# Opt level: O2

optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_> *
cmReadGccDepfile(optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                 *__return_storage_ptr__,char *filePath,string *prefix,
                GccDepfilePrependPaths prependPaths)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rule;
  string *psVar4;
  pointer pcVar5;
  enable_if_t<is_constructible_v<decay_t<vector<cmGccStyleDependency,_allocator<cmGccStyleDependency>_>_>,_std::vector<cmGccStyleDependency>_>,_optional<decay_t<vector<cmGccStyleDependency,_allocator<cmGccStyleDependency>_>_>_>_>
  *deps;
  cmGccDepfileLexerHelper helper;
  iterator __end1;
  cmGccDepfileLexerHelper local_e8;
  pointer local_c0;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  string local_50;
  
  local_e8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_e8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_e8.HelperState = Rule;
  local_e8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_e8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  bVar3 = cmGccDepfileLexerHelper::readFile(&local_e8,filePath);
  pcVar5 = local_e8.Content.
           super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar3) {
    local_c0 = (pointer)CONCAT44(local_e8.Content.
                                 super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 local_e8.Content.
                                 super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    pcVar2 = (pointer)CONCAT44(local_e8.Content.
                               super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               local_e8.Content.
                               super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_e8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_e8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_e8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_e8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    *(pointer *)
     &(__return_storage_ptr__->
      super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
      ._M_payload._M_value.
      super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl =
         pcVar5;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ._M_payload._M_value.
             super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl
     + 8) = local_c0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ._M_payload._M_value.
             super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl
     + 0x10) = pcVar2;
    local_88.View_._M_len = 0;
    local_88.View_._M_str = (pointer)0x0;
    local_88.Digits_[0] = '\0';
    local_88.Digits_[1] = '\0';
    local_88.Digits_[2] = '\0';
    local_88.Digits_[3] = '\0';
    local_88.Digits_[4] = '\0';
    local_88.Digits_[5] = '\0';
    local_88.Digits_[6] = '\0';
    local_88.Digits_[7] = '\0';
    (__return_storage_ptr__->
    super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
    ._M_engaged = true;
    std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
              ((vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> *)&local_88);
    for (; pcVar5 != local_c0; pcVar5 = pcVar5 + 1) {
      psVar1 = (pcVar5->rules).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar4 = (pcVar5->rules).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1
          ) {
        if ((prependPaths == All) && (prefix->_M_string_length != 0)) {
          bVar3 = cmsys::SystemTools::FileIsFullPath(psVar4);
          if (!bVar3) {
            local_88.View_._M_str = (prefix->_M_dataplus)._M_p;
            local_88.View_._M_len = prefix->_M_string_length;
            local_b8.View_._M_len = 1;
            local_b8.View_._M_str = local_b8.Digits_;
            local_b8.Digits_[0] = '/';
            cmStrCat<std::__cxx11::string>(&local_50,&local_88,&local_b8,psVar4);
            std::__cxx11::string::operator=((string *)psVar4,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
        bVar3 = cmsys::SystemTools::FileIsFullPath(psVar4);
        if (bVar3) {
          cmsys::SystemTools::CollapseFullPath((string *)&local_88,psVar4);
          std::__cxx11::string::operator=((string *)psVar4,(string *)&local_88);
          std::__cxx11::string::~string((string *)&local_88);
        }
        cmSystemTools::ConvertToLongPath(psVar4);
      }
      psVar1 = (pcVar5->paths).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar4 = (pcVar5->paths).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1
          ) {
        if (prefix->_M_string_length != 0) {
          bVar3 = cmsys::SystemTools::FileIsFullPath(psVar4);
          if (!bVar3) {
            local_88.View_._M_str = (prefix->_M_dataplus)._M_p;
            local_88.View_._M_len = prefix->_M_string_length;
            local_b8.View_._M_len = 1;
            local_b8.View_._M_str = local_b8.Digits_;
            local_b8.Digits_[0] = '/';
            cmStrCat<std::__cxx11::string>(&local_50,&local_88,&local_b8,psVar4);
            std::__cxx11::string::operator=((string *)psVar4,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
        bVar3 = cmsys::SystemTools::FileIsFullPath(psVar4);
        if (bVar3) {
          cmsys::SystemTools::CollapseFullPath((string *)&local_88,psVar4);
          std::__cxx11::string::operator=((string *)psVar4,(string *)&local_88);
          std::__cxx11::string::~string((string *)&local_88);
        }
        cmSystemTools::ConvertToLongPath(psVar4);
      }
    }
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
    ._M_engaged = false;
  }
  std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
            (&local_e8.Content);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmGccDepfileContent> cmReadGccDepfile(
  const char* filePath, const std::string& prefix,
  GccDepfilePrependPaths prependPaths)
{
  cmGccDepfileLexerHelper helper;
  if (!helper.readFile(filePath)) {
    return cm::nullopt;
  }
  auto deps = cm::make_optional(std::move(helper).extractContent());

  for (auto& dep : *deps) {
    for (auto& rule : dep.rules) {
      if (prependPaths == GccDepfilePrependPaths::All && !prefix.empty() &&
          !cmSystemTools::FileIsFullPath(rule)) {
        rule = cmStrCat(prefix, '/', rule);
      }
      if (cmSystemTools::FileIsFullPath(rule)) {
        rule = cmSystemTools::CollapseFullPath(rule);
      }
      cmSystemTools::ConvertToLongPath(rule);
    }
    for (auto& path : dep.paths) {
      if (!prefix.empty() && !cmSystemTools::FileIsFullPath(path)) {
        path = cmStrCat(prefix, '/', path);
      }
      if (cmSystemTools::FileIsFullPath(path)) {
        path = cmSystemTools::CollapseFullPath(path);
      }
      cmSystemTools::ConvertToLongPath(path);
    }
  }

  return deps;
}